

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O3

btDbvtNode * topdown(btDbvt *pdbvt,tNodeArray *leaves,int bu_treshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  btDbvt *pdbvt_00;
  int ni;
  uint uVar5;
  btDbvtNode **ppbVar6;
  btDbvtNode **ppbVar7;
  void *pvVar8;
  btDbvtNode *pbVar9;
  btDbvtNode *pbVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  btDbvtNode ***pppbVar15;
  uint uVar16;
  btDbvtVolume *volume;
  int *piVar17;
  uint uVar18;
  long lVar19;
  tNodeArray *ptVar20;
  int i_1;
  int iVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  tNodeArray sets [2];
  int splitcount [3] [2];
  undefined8 uStack_10c;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  tNodeArray local_d8;
  tNodeArray *local_b8;
  int local_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  uint local_98 [6];
  btDbvt *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (topdown(btDbvt*,btAlignedObjectArray<btDbvtNode*>&,int)::axis == '\0') {
    uStack_100 = 0x133c42;
    topdown();
  }
  uVar5 = leaves->m_size;
  uVar14 = (ulong)uVar5;
  if (1 < (int)uVar5) {
    if (bu_treshold < (int)uVar5) {
      ppbVar6 = leaves->m_data;
      pbVar9 = *ppbVar6;
      local_e8 = *(btDbvtNode ***)(pbVar9->volume).mx.m_floats;
      _fStack_e0 = *(undefined8 *)((pbVar9->volume).mx.m_floats + 2);
      local_f8._0_8_ = *(ulong *)(pbVar9->volume).mi.m_floats;
      local_f8._8_8_ = *(ulong *)((pbVar9->volume).mi.m_floats + 2);
      uVar12 = 1;
      do {
        pbVar9 = ppbVar6[uVar12];
        lVar19 = 4;
        do {
          fVar23 = *(float *)((long)&uStack_10c + lVar19 * 4 + 4);
          fVar24 = *(float *)((long)(&(pbVar9->volume).mi + -1) + lVar19 * 4);
          if (fVar24 <= fVar23) {
            fVar23 = fVar24;
          }
          fVar24 = *(float *)(local_f8 + lVar19 * 4);
          *(float *)((long)&uStack_10c + lVar19 * 4 + 4) = fVar23;
          fVar23 = (pbVar9->volume).mi.m_floats[lVar19];
          if (fVar24 <= fVar23) {
            fVar24 = fVar23;
          }
          *(float *)(local_f8 + lVar19 * 4) = fVar24;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 7);
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar14);
      local_80 = pdbvt;
      fStack_40 = (float)local_f8._8_4_;
      fStack_3c = (float)local_f8._12_4_;
      fVar23 = (float)local_e8;
      local_78 = (float)local_e8;
      fStack_74 = local_e8._4_4_;
      fStack_70 = fStack_e0;
      fStack_6c = fStack_dc;
      fStack_54 = (float)local_f8._4_4_ + local_e8._4_4_;
      fStack_a0 = (float)local_f8._8_4_ + fStack_e0;
      fStack_9c = (float)local_f8._12_4_ + fStack_dc;
      local_58 = fStack_54 * 0.5;
      fStack_50 = fStack_54;
      fStack_4c = fStack_54;
      lVar19 = 0x18;
      local_a8 = fStack_a0;
      fStack_a4 = fStack_9c;
      do {
        local_f8[lVar19] = 1;
        *(undefined8 *)((long)&uStack_100 + lVar19) = 0;
        *(undefined8 *)((long)&uStack_10c + lVar19) = 0;
        lVar19 = lVar19 + 0x20;
      } while (lVar19 != 0x58);
      local_48 = (float)local_f8._0_4_;
      fStack_44 = (float)local_f8._4_4_;
      local_68 = ((float)local_f8._0_4_ + fVar23) * 0.5;
      fStack_64 = (float)local_f8._4_4_;
      fStack_60 = fStack_40;
      fStack_5c = fStack_3c;
      local_a8 = local_a8 * 0.5;
      local_98[0] = 0;
      local_98[1] = 0;
      local_98[2] = 0;
      local_98[3] = 0;
      local_98[4] = 0;
      local_98[5] = 0;
      uVar12 = 0;
      do {
        pbVar9 = ppbVar6[uVar12];
        fVar23 = (pbVar9->volume).mi.m_floats[0];
        fVar24 = (pbVar9->volume).mi.m_floats[1];
        fVar1 = (pbVar9->volume).mx.m_floats[0];
        fVar2 = (pbVar9->volume).mx.m_floats[1];
        fVar3 = (pbVar9->volume).mi.m_floats[2];
        fVar4 = (pbVar9->volume).mx.m_floats[2];
        lVar19 = 0;
        do {
          piVar17 = (int *)((long)local_98 +
                           lVar19 + (ulong)(0.0 < *(float *)((long)topdown::axis[0].m_floats +
                                                            lVar19 * 2 + 8) *
                                                  ((fVar3 + fVar4) * 0.5 - local_a8) +
                                                  *(float *)((long)topdown::axis[0].m_floats +
                                                            lVar19 * 2) *
                                                  ((fVar23 + fVar1) * 0.5 - local_68) +
                                                  *(float *)((long)topdown::axis[0].m_floats +
                                                            lVar19 * 2 + 4) *
                                                  ((fVar24 + fVar2) * 0.5 - fStack_54 * 0.5)) * 4);
          *piVar17 = *piVar17 + 1;
          lVar19 = lVar19 + 8;
        } while (lVar19 != 0x18);
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar14);
      uVar12 = 0xffffffff;
      uVar13 = 0;
      uVar16 = uVar5;
      do {
        if ((0 < (int)local_98[uVar13 * 2]) && (0 < (int)local_98[uVar13 * 2 + 1])) {
          uVar18 = (uint)ABS((float)(int)(local_98[uVar13 * 2] - local_98[uVar13 * 2 + 1]));
          if ((int)uVar18 < (int)uVar16) {
            uVar12 = uVar13 & 0xffffffff;
          }
          if ((int)uVar18 <= (int)uVar16) {
            uVar16 = uVar18;
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != 3);
      local_ac = bu_treshold;
      local_b8 = leaves;
      if ((int)uVar12 < 0) {
        if ((int)local_f8._8_4_ <= (int)(uVar5 >> 1)) {
          lVar19 = (ulong)(uVar5 >> 1) + 1;
          uStack_100 = 0x13365d;
          ppbVar6 = (btDbvtNode **)btAlignedAllocInternal(lVar19 * 8,0x10);
          if (0 < (long)(int)local_f8._4_4_) {
            lVar11 = 0;
            do {
              ppbVar6[lVar11] = local_e8[lVar11];
              lVar11 = lVar11 + 1;
            } while ((int)local_f8._4_4_ != lVar11);
          }
          if ((local_e8 != (btDbvtNode **)0x0) && (fStack_e0._0_1_ == true)) {
            uStack_100 = 0x133697;
            btAlignedFreeInternal(local_e8);
          }
          fStack_e0._0_1_ = true;
          local_e8 = ppbVar6;
          local_f8._8_4_ = (int)lVar19;
          uVar14 = (ulong)(uint)local_b8->m_size;
        }
        uVar5 = (uint)uVar14;
        uVar16 = (int)((int)(uVar14 >> 0x1f) + uVar5) >> 1;
        if (local_d8.m_capacity < (int)uVar16) {
          if (uVar5 + 1 < 3) {
            ppbVar6 = (btDbvtNode **)0x0;
          }
          else {
            uStack_100 = 0x133a52;
            ppbVar6 = (btDbvtNode **)btAlignedAllocInternal((long)(int)uVar16 << 3,0x10);
          }
          if (0 < (long)local_d8.m_size) {
            lVar19 = 0;
            do {
              ppbVar6[lVar19] = local_d8.m_data[lVar19];
              lVar19 = lVar19 + 1;
            } while (local_d8.m_size != lVar19);
          }
          if ((local_d8.m_data != (btDbvtNode **)0x0) && (local_d8.m_ownsMemory == true)) {
            uStack_100 = 0x133a8c;
            btAlignedFreeInternal(local_d8.m_data);
          }
          local_d8.m_ownsMemory = true;
          local_d8.m_data = ppbVar6;
          local_d8.m_capacity = uVar16;
          uVar5 = local_b8->m_size;
        }
        if (0 < (int)uVar5) {
          uVar14 = 0;
          ptVar20 = local_b8;
          do {
            uVar12 = (ulong)(((uint)uVar14 & 1) << 5);
            ppbVar6 = ptVar20->m_data;
            uVar16 = *(uint *)(local_f8 + uVar12 + 4);
            if (uVar16 == *(uint *)(local_f8 + uVar12 + 8)) {
              iVar22 = uVar16 * 2;
              if (uVar16 == 0) {
                iVar22 = 1;
              }
              if ((int)uVar16 < iVar22) {
                if (iVar22 == 0) {
                  pvVar8 = (void *)0x0;
                }
                else {
                  uStack_100 = 0x133af7;
                  pvVar8 = btAlignedAllocInternal((long)iVar22 << 3,0x10);
                  uVar16 = *(uint *)(local_f8 + uVar12 + 4);
                }
                if (0 < (int)uVar16) {
                  uVar13 = 0;
                  do {
                    *(undefined8 *)((long)pvVar8 + uVar13 * 8) =
                         *(undefined8 *)(*(long *)((long)&local_e8 + uVar12) + uVar13 * 8);
                    uVar13 = uVar13 + 1;
                  } while (uVar16 != uVar13);
                }
                if ((*(void **)((long)&local_e8 + uVar12) != (void *)0x0) &&
                   (*(char *)((long)&fStack_e0 + uVar12) == '\x01')) {
                  uStack_100 = 0x133b34;
                  btAlignedFreeInternal(*(void **)((long)&local_e8 + uVar12));
                  uVar16 = *(uint *)(local_f8 + uVar12 + 4);
                }
                *(undefined1 *)((long)&fStack_e0 + uVar12) = 1;
                *(void **)((long)&local_e8 + uVar12) = pvVar8;
                *(int *)(local_f8 + uVar12 + 8) = iVar22;
                ptVar20 = local_b8;
              }
            }
            *(btDbvtNode **)(*(long *)((long)&local_e8 + uVar12) + (long)(int)uVar16 * 8) =
                 ppbVar6[uVar14];
            *(uint *)(local_f8 + uVar12 + 4) = uVar16 + 1;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar5);
        }
      }
      else {
        uVar5 = local_98[uVar12 * 2];
        if ((int)local_f8._8_4_ < (int)uVar5) {
          if (uVar5 == 0) {
            ppbVar6 = (btDbvtNode **)0x0;
          }
          else {
            uStack_100 = 0x13361e;
            ppbVar6 = (btDbvtNode **)btAlignedAllocInternal((long)(int)uVar5 << 3,0x10);
          }
          if (0 < (long)(int)local_f8._4_4_) {
            lVar19 = 0;
            do {
              ppbVar6[lVar19] = local_e8[lVar19];
              lVar19 = lVar19 + 1;
            } while ((int)local_f8._4_4_ != lVar19);
          }
          if ((local_e8 != (btDbvtNode **)0x0) && (fStack_e0._0_1_ == true)) {
            uStack_100 = 0x13370f;
            btAlignedFreeInternal(local_e8);
          }
          fStack_e0._0_1_ = true;
          local_e8 = ppbVar6;
          local_f8._8_4_ = uVar5;
        }
        uVar5 = local_98[uVar12 * 2 + 1];
        if (local_d8.m_capacity < (int)uVar5) {
          if (uVar5 == 0) {
            ppbVar6 = (btDbvtNode **)0x0;
          }
          else {
            uStack_100 = 0x133741;
            ppbVar6 = (btDbvtNode **)btAlignedAllocInternal((long)(int)uVar5 << 3,0x10);
          }
          if (0 < (long)local_d8.m_size) {
            lVar19 = 0;
            do {
              ppbVar6[lVar19] = local_d8.m_data[lVar19];
              lVar19 = lVar19 + 1;
            } while (local_d8.m_size != lVar19);
          }
          if ((local_d8.m_data != (btDbvtNode **)0x0) && (local_d8.m_ownsMemory == true)) {
            uStack_100 = 0x133780;
            btAlignedFreeInternal(local_d8.m_data);
          }
          local_d8.m_ownsMemory = true;
          local_d8.m_data = ppbVar6;
          local_d8.m_capacity = uVar5;
        }
        lVar19 = (long)(int)local_f8._4_4_;
        ptVar20 = local_b8;
        if (lVar19 < 0) {
          if ((int)local_f8._8_4_ < 0) {
            if ((local_e8 != (btDbvtNode **)0x0) && (fStack_e0._0_1_ == true)) {
              uStack_100 = 0x1337ba;
              btAlignedFreeInternal(local_e8);
            }
            fStack_e0._0_1_ = true;
            local_e8 = (btDbvtNode **)0x0;
            local_f8._8_8_ = local_f8._8_8_ & 0xffffffff00000000;
            ptVar20 = local_b8;
          }
          do {
            local_e8[lVar19] = (btDbvtNode *)0x0;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 0);
        }
        local_f8._0_8_ = local_f8._0_8_ & 0xffffffff;
        lVar19 = (long)local_d8.m_size;
        if (lVar19 < 0) {
          if (local_d8.m_capacity < 0) {
            if ((local_d8.m_data != (btDbvtNode **)0x0) && (local_d8.m_ownsMemory == true)) {
              uStack_100 = 0x133816;
              btAlignedFreeInternal(local_d8.m_data);
            }
            local_d8.m_ownsMemory = true;
            local_d8.m_data = (btDbvtNode **)0x0;
            local_d8.m_capacity = 0;
            ptVar20 = local_b8;
          }
          do {
            local_d8.m_data[lVar19] = (btDbvtNode *)0x0;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 0);
        }
        local_d8.m_size = 0;
        iVar22 = ptVar20->m_size;
        if (0 < (long)iVar22) {
          lVar19 = 0;
          do {
            ppbVar6 = ptVar20->m_data;
            pbVar9 = ppbVar6[lVar19];
            if (0.0 <= (((pbVar9->volume).mi.m_floats[2] + (pbVar9->volume).mx.m_floats[2]) * 0.5 -
                       local_a8) * topdown::axis[uVar12].m_floats[2] +
                       (((pbVar9->volume).mi.m_floats[0] + (pbVar9->volume).mx.m_floats[0]) * 0.5 -
                       local_68) * topdown::axis[uVar12].m_floats[0] +
                       (((pbVar9->volume).mi.m_floats[1] + (pbVar9->volume).mx.m_floats[1]) * 0.5 -
                       local_58) * topdown::axis[uVar12].m_floats[1]) {
              if (local_d8.m_size == local_d8.m_capacity) {
                uVar5 = local_d8.m_size * 2;
                if (local_d8.m_size == 0) {
                  uVar5 = 1;
                }
                if (local_d8.m_size < (int)uVar5) {
                  if (uVar5 == 0) {
                    ppbVar7 = (btDbvtNode **)0x0;
                  }
                  else {
                    uStack_100 = 0x13394b;
                    ppbVar7 = (btDbvtNode **)btAlignedAllocInternal((long)(int)uVar5 << 3,0x10);
                  }
                  if (0 < local_d8.m_size) {
                    uVar14 = 0;
                    do {
                      ppbVar7[uVar14] = local_d8.m_data[uVar14];
                      uVar14 = uVar14 + 1;
                    } while ((uint)local_d8.m_size != uVar14);
                  }
                  if ((local_d8.m_data != (btDbvtNode **)0x0) && (local_d8.m_ownsMemory == true)) {
                    uStack_100 = 0x1339fd;
                    btAlignedFreeInternal(local_d8.m_data);
                  }
                  local_d8.m_ownsMemory = true;
                  local_d8.m_data = ppbVar7;
                  local_d8.m_capacity = uVar5;
                  pppbVar15 = &local_d8.m_data;
                  piVar17 = &local_d8.m_size;
                  uVar5 = local_d8.m_size;
                  goto LAB_00133a1a;
                }
              }
              pppbVar15 = &local_d8.m_data;
              piVar17 = &local_d8.m_size;
              uVar5 = local_d8.m_size;
            }
            else {
              if (local_f8._4_4_ == local_f8._8_4_) {
                iVar21 = local_f8._4_4_ * 2;
                if (local_f8._4_4_ == 0) {
                  iVar21 = 1;
                }
                if ((int)local_f8._4_4_ < iVar21) {
                  if (iVar21 == 0) {
                    ppbVar7 = (btDbvtNode **)0x0;
                  }
                  else {
                    uStack_100 = 0x13390a;
                    ppbVar7 = (btDbvtNode **)btAlignedAllocInternal((long)iVar21 << 3,0x10);
                  }
                  if (0 < (int)local_f8._4_4_) {
                    uVar14 = 0;
                    do {
                      ppbVar7[uVar14] = local_e8[uVar14];
                      uVar14 = uVar14 + 1;
                    } while ((uint)local_f8._4_4_ != uVar14);
                  }
                  uVar5 = local_f8._4_4_;
                  if ((local_e8 != (btDbvtNode **)0x0) && (fStack_e0._0_1_ == true)) {
                    uStack_100 = 0x1339a8;
                    btAlignedFreeInternal(local_e8);
                    uVar5 = local_f8._4_4_;
                  }
                  fStack_e0._0_1_ = true;
                  local_e8 = ppbVar7;
                  local_f8._8_4_ = iVar21;
                  pppbVar15 = (btDbvtNode ***)&local_e8;
                  piVar17 = (int *)(local_f8 + 4);
LAB_00133a1a:
                  pbVar9 = ppbVar6[lVar19];
                  ptVar20 = local_b8;
                  goto LAB_00133a23;
                }
              }
              pppbVar15 = (btDbvtNode ***)&local_e8;
              piVar17 = (int *)(local_f8 + 4);
              uVar5 = local_f8._4_4_;
            }
LAB_00133a23:
            (*pppbVar15)[(int)uVar5] = pbVar9;
            *piVar17 = uVar5 + 1;
            lVar19 = lVar19 + 1;
          } while (lVar19 != iVar22);
        }
      }
      pdbvt_00 = local_80;
      pbVar9 = local_80->m_free;
      if (pbVar9 == (btDbvtNode *)0x0) {
        uStack_100 = 0x133b96;
        pbVar9 = (btDbvtNode *)btAlignedAllocInternal(0x38,0x10);
        pbVar9->parent = (btDbvtNode *)0x0;
        (pbVar9->field_2).childs[0] = (btDbvtNode *)0x0;
        (pbVar9->volume).mx.m_floats[0] = 0.0;
        (pbVar9->volume).mx.m_floats[1] = 0.0;
        (pbVar9->volume).mx.m_floats[2] = 0.0;
        (pbVar9->volume).mx.m_floats[3] = 0.0;
        (pbVar9->volume).mi.m_floats[0] = 0.0;
        (pbVar9->volume).mi.m_floats[1] = 0.0;
        (pbVar9->volume).mi.m_floats[2] = 0.0;
        (pbVar9->volume).mi.m_floats[3] = 0.0;
        (pbVar9->field_2).childs[1] = (btDbvtNode *)0x0;
      }
      else {
        local_80->m_free = (btDbvtNode *)0x0;
      }
      iVar22 = local_ac;
      pbVar9->parent = (btDbvtNode *)0x0;
      (pbVar9->field_2).childs[0] = (btDbvtNode *)0x0;
      (pbVar9->field_2).childs[1] = (btDbvtNode *)0x0;
      *(ulong *)(pbVar9->volume).mi.m_floats = CONCAT44(fStack_44,local_48);
      *(ulong *)((pbVar9->volume).mi.m_floats + 2) = CONCAT44(fStack_3c,fStack_40);
      *(ulong *)(pbVar9->volume).mx.m_floats = CONCAT44(fStack_74,local_78);
      *(ulong *)((pbVar9->volume).mx.m_floats + 2) = CONCAT44(fStack_6c,fStack_70);
      uStack_100 = 0x133be9;
      pbVar10 = topdown(pdbvt_00,(tNodeArray *)local_f8,local_ac);
      (pbVar9->field_2).childs[0] = pbVar10;
      uStack_100 = 0x133bfc;
      pbVar10 = topdown(pdbvt_00,&local_d8,iVar22);
      (pbVar9->field_2).childs[1] = pbVar10;
      (pbVar9->field_2).childs[0]->parent = pbVar9;
      (pbVar9->field_2).childs[1]->parent = pbVar9;
      lVar19 = 0x20;
      do {
        uStack_100 = 0x133c1e;
        btAlignedObjectArray<btDbvtNode_*>::~btAlignedObjectArray
                  ((btAlignedObjectArray<btDbvtNode_*> *)(local_f8 + lVar19));
        lVar19 = lVar19 + -0x20;
      } while (lVar19 != -0x20);
      return pbVar9;
    }
    uStack_100 = 0x133631;
    bottomup(pdbvt,leaves);
  }
  return *leaves->m_data;
}

Assistant:

static btDbvtNode*			topdown(btDbvt* pdbvt,
									tNodeArray& leaves,
									int bu_treshold)
{
	static const btVector3	axis[]={btVector3(1,0,0),
		btVector3(0,1,0),
		btVector3(0,0,1)};
	if(leaves.size()>1)
	{
		if(leaves.size()>bu_treshold)
		{
			const btDbvtVolume	vol=bounds(leaves);
			const btVector3			org=vol.Center();
			tNodeArray				sets[2];
			int						bestaxis=-1;
			int						bestmidp=leaves.size();
			int						splitcount[3][2]={{0,0},{0,0},{0,0}};
			int i;
			for( i=0;i<leaves.size();++i)
			{
				const btVector3	x=leaves[i]->volume.Center()-org;
				for(int j=0;j<3;++j)
				{
					++splitcount[j][btDot(x,axis[j])>0?1:0];
				}
			}
			for( i=0;i<3;++i)
			{
				if((splitcount[i][0]>0)&&(splitcount[i][1]>0))
				{
					const int	midp=(int)btFabs(btScalar(splitcount[i][0]-splitcount[i][1]));
					if(midp<bestmidp)
					{
						bestaxis=i;
						bestmidp=midp;
					}
				}
			}
			if(bestaxis>=0)
			{
				sets[0].reserve(splitcount[bestaxis][0]);
				sets[1].reserve(splitcount[bestaxis][1]);
				split(leaves,sets[0],sets[1],org,axis[bestaxis]);
			}
			else
			{
				sets[0].reserve(leaves.size()/2+1);
				sets[1].reserve(leaves.size()/2);
				for(int i=0,ni=leaves.size();i<ni;++i)
				{
					sets[i&1].push_back(leaves[i]);
				}
			}
			btDbvtNode*	node=createnode(pdbvt,0,vol,0);
			node->childs[0]=topdown(pdbvt,sets[0],bu_treshold);
			node->childs[1]=topdown(pdbvt,sets[1],bu_treshold);
			node->childs[0]->parent=node;
			node->childs[1]->parent=node;
			return(node);
		}
		else
		{
			bottomup(pdbvt,leaves);
			return(leaves[0]);
		}
	}
	return(leaves[0]);
}